

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

void wasm::
     CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
     ::scan(CFGBuilder *self,Expression **currp)

{
  Id IVar1;
  Expression *pEVar2;
  Module *pMVar3;
  long lVar4;
  char *__function;
  code *pcVar5;
  uint uVar6;
  ulong uVar7;
  
  pEVar2 = *currp;
  IVar1 = pEVar2->_id;
  if (TableInitId < IVar1) {
    if (IVar1 < SuspendId) {
      switch(IVar1) {
      case TryId:
        Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                  ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,
                   doEndTry,currp);
        if (pEVar2->_id == TryId) {
          if (*(long *)(pEVar2 + 5) != 0) {
            uVar6 = 1;
            uVar7 = 0;
            do {
              Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                        ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)
                         self,doEndCatch,currp);
              if (*(ulong *)(pEVar2 + 5) <= uVar7) {
                __assert_fail("index < usedElements",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                              ,0xbc,
                              "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                             );
              }
              Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                        ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)
                         self,scan,(Expression **)(uVar7 * 8 + pEVar2[4].type.id));
              Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                        ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)
                         self,doStartCatch,currp);
              uVar7 = (ulong)uVar6;
              uVar6 = uVar6 + 1;
            } while (uVar7 < *(ulong *)(pEVar2 + 5));
          }
          Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                    ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,
                     doStartCatches,currp);
          if (pEVar2->_id == TryId) {
            Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                      ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self
                       ,scan,(Expression **)(pEVar2 + 2));
            pcVar5 = doStartTry;
            goto LAB_00cf2b5c;
          }
        }
        __function = "T *wasm::Expression::cast() [T = wasm::Try]";
        goto LAB_00cf2c7f;
      case TryTableId:
        pcVar5 = doEndTryTable;
        break;
      case ThrowId:
      case RethrowId:
      case ThrowRefId:
        pcVar5 = doEndThrow;
        break;
      default:
        goto switchD_00cf29c3_caseD_39;
      case CallRefId:
        lVar4 = 0x38;
        goto LAB_00cf2af6;
      case BrOnId:
        goto switchD_00cf29c3_caseD_40;
      }
      goto LAB_00cf2b22;
    }
    if (IVar1 - 0x5d < 2) {
      pcVar5 = doEndResume;
      goto LAB_00cf2b22;
    }
    if ((IVar1 != SuspendId) && (IVar1 != StackSwitchId)) goto switchD_00cf29c3_caseD_39;
    goto LAB_00cf2b06;
  }
  switch(IVar1) {
  case BlockId:
    pcVar5 = doEndBlock;
    break;
  case IfId:
    Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
              ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,doEndIf
               ,currp);
    if (pEVar2->_id == IfId) {
      if (*(long *)(pEVar2 + 2) != 0) {
        Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                  ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,
                   scan,(Expression **)(pEVar2 + 2));
        Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                  ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,
                   doStartIfFalse,currp);
      }
      if (pEVar2->_id == IfId) {
        Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                  ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,
                   scan,(Expression **)&pEVar2[1].type);
        Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
                  ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,
                   doStartIfTrue,currp);
        if (pEVar2->_id == IfId) {
          currp = (Expression **)(pEVar2 + 1);
          pcVar5 = scan;
          goto LAB_00cf2b5c;
        }
      }
    }
    __function = "T *wasm::Expression::cast() [T = wasm::If]";
LAB_00cf2c7f:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,__function);
  case LoopId:
    pcVar5 = doEndLoop;
    break;
  case BreakId:
  case SwitchId:
switchD_00cf29c3_caseD_40:
    pcVar5 = doEndBranch;
    break;
  case CallId:
    lVar4 = 0x40;
    goto LAB_00cf2af6;
  case CallIndirectId:
    lVar4 = 0x50;
LAB_00cf2af6:
    if ((&pEVar2->_id)[lVar4] != InvalidId) {
switchD_00cf29e6_caseD_13:
      pcVar5 = doEndReturn;
      break;
    }
LAB_00cf2b06:
    pMVar3 = (self->
             super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             ).super_PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.
             super_Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>.currModule;
    pcVar5 = doEndCall;
    if ((pMVar3 == (Module *)0x0) || (((pMVar3->features).features & 0x40) != 0)) break;
    goto LAB_00cf2b2d;
  default:
switchD_00cf29c3_caseD_39:
    if ((pEVar2->type).id == 1) {
      pcVar5 = doStartUnreachableBlock;
      break;
    }
    goto LAB_00cf2b2d;
  case ReturnId:
    goto switchD_00cf29e6_caseD_13;
  }
LAB_00cf2b22:
  Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
            ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,pcVar5,
             currp);
LAB_00cf2b2d:
  PostWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::scan(self,currp);
  if (pEVar2->_id == TryTableId) {
    pcVar5 = doStartTryTable;
  }
  else {
    if (pEVar2->_id != LoopId) {
      return;
    }
    pcVar5 = doStartLoop;
  }
LAB_00cf2b5c:
  Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::pushTask
            ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)self,pcVar5,
             currp);
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

    switch (curr->_id) {
      case Expression::Id::BlockId: {
        self->pushTask(SubType::doEndBlock, currp);
        break;
      }
      case Expression::Id::IfId: {
        self->pushTask(SubType::doEndIf, currp);
        auto* ifFalse = curr->cast<If>()->ifFalse;
        if (ifFalse) {
          self->pushTask(SubType::scan, &curr->cast<If>()->ifFalse);
          self->pushTask(SubType::doStartIfFalse, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<If>()->ifTrue);
        self->pushTask(SubType::doStartIfTrue, currp);
        self->pushTask(SubType::scan, &curr->cast<If>()->condition);
        return; // don't do anything else
      }
      case Expression::Id::LoopId: {
        self->pushTask(SubType::doEndLoop, currp);
        break;
      }
      case Expression::Id::CallId:
      case Expression::Id::CallIndirectId:
      case Expression::Id::CallRefId: {
        if (isReturnCall(curr)) {
          self->pushTask(SubType::doEndReturn, currp);
        } else {
          auto* module = self->getModule();
          if (!module || module->features.hasExceptionHandling()) {
            // This call might throw, so run the code to handle that.
            self->pushTask(SubType::doEndCall, currp);
          }
        }
        break;
      }
      case Expression::Id::ReturnId:
        self->pushTask(SubType::doEndReturn, currp);
        break;
      case Expression::Id::TryId: {
        self->pushTask(SubType::doEndTry, currp);
        auto& catchBodies = curr->cast<Try>()->catchBodies;
        for (Index i = 0; i < catchBodies.size(); i++) {
          self->pushTask(doEndCatch, currp);
          self->pushTask(SubType::scan, &catchBodies[i]);
          self->pushTask(doStartCatch, currp);
        }
        self->pushTask(SubType::doStartCatches, currp);
        self->pushTask(SubType::scan, &curr->cast<Try>()->body);
        self->pushTask(SubType::doStartTry, currp);
        return; // don't do anything else
      }
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doEndTryTable, currp);
        break;
      }
      case Expression::Id::ThrowId:
      case Expression::Id::RethrowId:
      case Expression::Id::ThrowRefId: {
        self->pushTask(SubType::doEndThrow, currp);
        break;
      }
      case Expression::Id::ResumeId:
      case Expression::Id::ResumeThrowId: {
        self->pushTask(SubType::doEndResume, currp);
        break;
      }
      case Expression::Id::SuspendId:
      case Expression::Id::StackSwitchId: {
        auto* module = self->getModule();
        if (!module || module->features.hasExceptionHandling()) {
          // This might throw, so run the code to handle that.
          self->pushTask(SubType::doEndCall, currp);
        }
        break;
      }
      default: {
        if (Properties::isBranch(curr)) {
          self->pushTask(SubType::doEndBranch, currp);
        } else if (curr->type == Type::unreachable) {
          self->pushTask(SubType::doStartUnreachableBlock, currp);
        }
      }
    }

    PostWalker<SubType, VisitorType>::scan(self, currp);

    switch (curr->_id) {
      case Expression::Id::LoopId: {
        self->pushTask(SubType::doStartLoop, currp);
        break;
      }
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doStartTryTable, currp);
        break;
      }
      default: {}
    }
  }